

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O2

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnElemSegmentElemExpr_RefNull
          (BinaryReaderIR *this,Index segment_index,Type type)

{
  pointer ppEVar1;
  ElemSegment *pEVar2;
  ExprList init_expr;
  Location loc;
  Type local_70;
  Type local_68;
  undefined1 local_60 [16];
  anon_union_16_2_ecfd7102_for_Location_1 aStack_50;
  Location local_40;
  
  ppEVar1 = (this->module_->elem_segments).
            super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_60._0_8_ = type;
  if (((long)(this->module_->elem_segments).
             super__Vector_base<wabt::ElemSegment_*,_std::allocator<wabt::ElemSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppEVar1 >> 3) - 1U == (ulong)segment_index) {
    pEVar2 = ppEVar1[segment_index];
    GetLocation(&local_40,this);
    local_60._8_8_ = (char *)0x0;
    aStack_50.field_1.offset =
         (anon_struct_8_1_645b55d1_for_anon_union_16_2_ecfd7102_for_Location_1_2)0;
    aStack_50._8_8_ = 0;
    std::make_unique<wabt::RefTypeExpr<(wabt::ExprType)37>,wabt::Type&,wabt::Location&>
              (&local_70,(Location *)local_60);
    local_68 = local_70;
    local_70.enum_ = Any;
    local_70.type_index_ = 0;
    intrusive_list<wabt::Expr>::push_back
              ((intrusive_list<wabt::Expr> *)(local_60 + 8),
               (unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_68);
    if (local_68 != (Type)0x0) {
      (**(code **)(*(long *)local_68 + 8))();
    }
    local_68.enum_ = Any;
    local_68.type_index_ = 0;
    if (local_70 != (Type)0x0) {
      (**(code **)(*(long *)local_70 + 8))();
    }
    std::vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>::
    emplace_back<wabt::intrusive_list<wabt::Expr>>
              ((vector<wabt::intrusive_list<wabt::Expr>,std::allocator<wabt::intrusive_list<wabt::Expr>>>
                *)&pEVar2->elem_exprs,(intrusive_list<wabt::Expr> *)(local_60 + 8));
    intrusive_list<wabt::Expr>::clear((intrusive_list<wabt::Expr> *)(local_60 + 8));
    return (Result)Ok;
  }
  __assert_fail("segment_index == module_->elem_segments.size() - 1",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-reader-ir.cc"
                ,0x519,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index, Type)"
               );
}

Assistant:

Result BinaryReaderIR::OnElemSegmentElemExpr_RefNull(Index segment_index,
                                                     Type type) {
  assert(segment_index == module_->elem_segments.size() - 1);
  ElemSegment* segment = module_->elem_segments[segment_index];
  Location loc = GetLocation();
  ExprList init_expr;
  init_expr.push_back(std::make_unique<RefNullExpr>(type, loc));
  segment->elem_exprs.push_back(std::move(init_expr));
  return Result::Ok;
}